

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

void __thiscall State::State(State *this,int w,int h)

{
  int iVar1;
  int *__first;
  long lVar2;
  ulong uVar3;
  long lVar4;
  State local_50;
  
  iVar1 = h * w;
  lVar4 = (long)iVar1;
  uVar3 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar3 = lVar4 * 4;
  }
  __first = (int *)operator_new__(uVar3);
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      __first[lVar2] = (int)lVar2;
      lVar2 = lVar2 + 1;
    } while (lVar4 != lVar2);
  }
  uVar3 = std::chrono::_V2::system_clock::now();
  local_50.tiles = (int **)(uVar3 % 0x7fffffff + (ulong)(uVar3 % 0x7fffffff == 0));
  std::shuffle<int*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (__first,__first + lVar4,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_50);
  State(&local_50,w,h,__first);
  operator=(this,&local_50);
  if (local_50.tiles != (int **)0x0) {
    operator_delete__(local_50.tiles);
  }
  operator_delete__(__first);
  return;
}

Assistant:

State::State(int w, int h) {
    auto numbers = new int[w * h];
    for (int i = 0; i < w * h; i++) {
        numbers[i] = i;
    }

    long seed = std::chrono::high_resolution_clock::now().time_since_epoch().count();
    std::shuffle(&numbers[0], &numbers[w * h], std::default_random_engine(seed));

    *this = State(w, h, numbers);
    delete[] numbers;
}